

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

resizable_tensor * __thiscall
dlib::resizable_tensor::operator=
          (resizable_tensor *this,
          matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
          *item)

{
  long lVar1;
  long lVar2;
  size_t new_size;
  
  lVar1 = *(long *)(item + 8);
  if (((this->super_tensor).m_n != lVar1) ||
     ((this->super_tensor).m_nr * (this->super_tensor).m_k * (this->super_tensor).m_nc -
      *(long *)(item + 0x10) != 0)) {
    lVar2 = *(long *)(item + 0x10);
    (this->super_tensor).m_n = lVar1;
    (this->super_tensor).m_k = lVar2;
    (this->super_tensor).m_nr = 1;
    (this->super_tensor).m_nc = 1;
    new_size = lVar2 * lVar1;
    (this->super_tensor).m_size = new_size;
    if ((long)(this->data_instance).data_size < (long)new_size) {
      gpu_data::set_size(&this->data_instance,new_size);
    }
  }
  tensor::operator=(&this->super_tensor,item);
  return this;
}

Assistant:

resizable_tensor& operator= (
            const matrix_exp<EXP>& item
        )
        {
            if (!(num_samples() == item.nr() && k()*nr()*nc() == item.nc()))
                set_size(item.nr(), item.nc());
            tensor::operator=(item);
            return *this;
        }